

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1d5768::CAPITask::CAPITask(CAPITask *this,llb_task_delegate_t delegate)

{
  CAPITask *this_local;
  
  llbuild::core::Task::Task(&this->super_Task);
  (this->super_Task)._vptr_Task = (_func_int **)&PTR__CAPITask_0043a2f8;
  memcpy(&this->cAPIDelegate,&delegate,0x28);
  if ((this->cAPIDelegate).start == (_func_void_void_ptr_void_ptr_llb_task_interface_t *)0x0) {
    __assert_fail("cAPIDelegate.start && \"missing task start function\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/Core-C-API.cpp"
                  ,0x80,"(anonymous namespace)::CAPITask::CAPITask(llb_task_delegate_t)");
  }
  if ((this->cAPIDelegate).provide_value ==
      (_func_void_void_ptr_void_ptr_llb_task_interface_t_uintptr_t_llb_data_t_ptr *)0x0) {
    __assert_fail("cAPIDelegate.provide_value && \"missing task provide_value function\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/Core-C-API.cpp"
                  ,0x82,"(anonymous namespace)::CAPITask::CAPITask(llb_task_delegate_t)");
  }
  if ((this->cAPIDelegate).inputs_available ==
      (_func_void_void_ptr_void_ptr_llb_task_interface_t *)0x0) {
    __assert_fail("cAPIDelegate.inputs_available && \"missing task inputs_available function\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/Core-C-API.cpp"
                  ,0x84,"(anonymous namespace)::CAPITask::CAPITask(llb_task_delegate_t)");
  }
  return;
}

Assistant:

CAPITask(llb_task_delegate_t delegate) : cAPIDelegate(delegate) {
      assert(cAPIDelegate.start && "missing task start function");
      assert(cAPIDelegate.provide_value &&
             "missing task provide_value function");
      assert(cAPIDelegate.inputs_available &&
             "missing task inputs_available function");
  }